

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCec.c
# Opt level: O1

void Cec_ManTransformPattern(Gia_Man_t *p,int iOut,int *pValues)

{
  Vec_Int_t *pVVar1;
  Abc_Cex_t *pAVar2;
  ulong uVar3;
  
  if (p->pCexComb == (Abc_Cex_t *)0x0) {
    pAVar2 = Abc_CexAlloc(0,p->vCis->nSize,1);
    p->pCexComb = pAVar2;
    pAVar2->iPo = iOut;
    pVVar1 = p->vCis;
    if (0 < pVVar1->nSize) {
      uVar3 = 0;
      do {
        if ((pValues != (int *)0x0) && (pValues[uVar3] != 0)) {
          (&pAVar2[1].iPo)[uVar3 >> 5 & 0x7ffffff] =
               (&pAVar2[1].iPo)[uVar3 >> 5 & 0x7ffffff] | 1 << ((byte)uVar3 & 0x1f);
        }
        uVar3 = uVar3 + 1;
      } while ((long)uVar3 < (long)pVVar1->nSize);
    }
    return;
  }
  __assert_fail("p->pCexComb == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecCec.c"
                ,0x34,"void Cec_ManTransformPattern(Gia_Man_t *, int, int *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Saves the input pattern with the given number.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cec_ManTransformPattern( Gia_Man_t * p, int iOut, int * pValues )
{
    int i;
    assert( p->pCexComb == NULL );
    p->pCexComb = Abc_CexAlloc( 0, Gia_ManCiNum(p), 1 );
    p->pCexComb->iPo = iOut;
    for ( i = 0; i < Gia_ManCiNum(p); i++ )
        if ( pValues && pValues[i] )
            Abc_InfoSetBit( p->pCexComb->pData, i );
}